

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall
TApp_OptionFromDefaultsSubcommands_Test::~TApp_OptionFromDefaultsSubcommands_Test
          (TApp_OptionFromDefaultsSubcommands_Test *this)

{
  TApp_OptionFromDefaultsSubcommands_Test *this_local;
  
  TApp::~TApp(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, OptionFromDefaultsSubcommands) {
    // Initial defaults
    EXPECT_FALSE(app.option_defaults()->get_required());
    EXPECT_EQ(app.option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::Throw);
    EXPECT_FALSE(app.option_defaults()->get_ignore_case());
    EXPECT_TRUE(app.option_defaults()->get_configurable());
    EXPECT_EQ(app.option_defaults()->get_group(), "Options");

    app.option_defaults()
        ->required()
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast)
        ->ignore_case()
        ->configurable(false)
        ->group("Something");

    auto app2 = app.add_subcommand("app2");

    EXPECT_TRUE(app2->option_defaults()->get_required());
    EXPECT_EQ(app2->option_defaults()->get_multi_option_policy(), CLI::MultiOptionPolicy::TakeLast);
    EXPECT_TRUE(app2->option_defaults()->get_ignore_case());
    EXPECT_FALSE(app2->option_defaults()->get_configurable());
    EXPECT_EQ(app2->option_defaults()->get_group(), "Something");
}